

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Mux_Man_t * Mux_ManAlloc(Gia_Man_t *pGia)

{
  Mux_Man_t *pMVar1;
  Abc_Nam_t *pAVar2;
  Vec_Wec_t *pVVar3;
  Mux_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pMVar1 = (Mux_Man_t *)calloc(1,0x18);
  pMVar1->pGia = pGia;
  pAVar2 = Abc_NamStart(10000,0x32);
  pMVar1->pNames = pAVar2;
  pVVar3 = Vec_WecAlloc(1000);
  pMVar1->vTops = pVVar3;
  Vec_WecPushLevel(pMVar1->vTops);
  return pMVar1;
}

Assistant:

Mux_Man_t * Mux_ManAlloc( Gia_Man_t * pGia )
{
    Mux_Man_t * p;
    p = ABC_CALLOC( Mux_Man_t, 1 );
    p->pGia   = pGia;
    p->pNames = Abc_NamStart( 10000, 50 );
    p->vTops  = Vec_WecAlloc( 1000 );
    Vec_WecPushLevel( p->vTops );
    return p;
}